

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ScalarType * __thiscall
slang::BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind_const&,bool&>
          (BumpAllocator *this,Kind *args,bool *args_1)

{
  ScalarType *pSVar1;
  size_t in_RDX;
  size_t in_RSI;
  BumpAllocator *in_RDI;
  bool in_stack_0000000b;
  Kind in_stack_0000000c;
  
  pSVar1 = (ScalarType *)allocate(in_RDI,in_RSI,in_RDX);
  slang::ast::ScalarType::ScalarType((ScalarType *)args_1,in_stack_0000000c,in_stack_0000000b);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }